

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O3

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::appendUint8(InternalMsg *this,uint8_t what)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = (this->currentPage).ptr;
  if (puVar1 == (uint8_t *)0x0) {
    if (this->totalSz == 0) {
      reserveSpaceForConvertionToTag(this);
    }
    else {
      implAddPage(this);
    }
    puVar1 = (this->currentPage).ptr;
    if (puVar1 == (uint8_t *)0x0) {
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x216,"currentPage.page() != nullptr",true);
      puVar1 = (this->currentPage).ptr;
    }
  }
  uVar3 = this->totalSz & 0xfff;
  puVar1[uVar3] = what;
  uVar2 = this->totalSz + 1;
  this->totalSz = uVar2;
  if (uVar3 == 0xfff) {
    if ((uVar2 & 0xfff) != 0) {
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x21e,"offsetInCurrentPage() == 0",true);
    }
    (this->currentPage).ptr = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void appendUint8( uint8_t what )
		{
			if ( currentPage.page() == nullptr )
			{
				if ( totalSz )
					implAddPage();
				else
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
					reserveSpaceForConvertionToTag();
				}
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
			}
			size_t remainingInPage = remainingSizeInCurrentPage();
			NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, remainingInPage != 0 );
			*(currentPage.page() + offsetInCurrentPage()) = what;
			++totalSz;
			if( 1 == remainingInPage )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
				currentPage.init();
			}
		}